

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O3

void Eigen::internal::general_matrix_vector_product<long,_double,_1,_false,_double,_false,_0>::run
               (long rows,long cols,double *lhs,long lhsStride,double *rhs,long rhsIncr,
               ResScalar *res,long resIncr,ResScalar alpha)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  long j;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  long j_3;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  long local_c8;
  ulong local_a8;
  double *local_a0;
  
  uVar11 = (ulong)((uint)((ulong)rhs >> 3) & 1);
  if (cols <= (long)uVar11) {
    uVar11 = cols;
  }
  if (((ulong)rhs & 7) != 0) {
    uVar11 = cols;
  }
  uVar12 = (ulong)((uint)lhsStride & 1);
  uVar13 = (ulong)((uint)((ulong)lhs >> 3) & 1);
  if (cols <= (long)uVar13) {
    uVar13 = cols;
  }
  if (((ulong)lhs & 7) != 0) {
    uVar13 = cols;
  }
  local_a8 = uVar12;
  if ((((uint)rhs | (uint)lhs) & 7) == 0) {
    lVar4 = uVar11 + (cols - uVar11 & 0xfffffffffffffffe);
    lVar21 = 0;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      if (uVar11 == (long)(lVar21 * uVar12 + uVar13) % 2) {
        if (rows <= lVar21) {
          lVar21 = rows;
        }
        goto LAB_00112fb3;
      }
      lVar21 = 1;
      bVar3 = false;
    } while (bVar7);
    local_a8 = 3;
    lVar21 = 0;
  }
  else {
    lVar4 = 0;
    uVar11 = 0;
    lVar21 = 0;
  }
LAB_00112fb3:
  uVar22 = rows - lVar21;
  uVar13 = uVar22 + 3;
  if (-1 < (long)uVar22) {
    uVar13 = uVar22;
  }
  lVar8 = (uVar13 & 0xfffffffffffffffc) + lVar21;
  if (3 < (long)uVar22) {
    lVar14 = uVar12 * 2 + 1;
    lVar1 = (ulong)(uVar12 == 0) * 2 + 1;
    lVar9 = (lVar1 + lVar21) * lhsStride;
    pdVar15 = lhs + lVar9;
    lVar16 = (lVar21 + 2) * lhsStride;
    local_a0 = lhs + lVar16;
    lVar5 = (lVar14 + lVar21) * lhsStride;
    pdVar18 = lhs + lVar5;
    pdVar19 = lhs + lVar21 * lhsStride;
    pdVar6 = lhs + lVar9 + lVar4;
    pdVar20 = lhs + lVar16 + lVar4;
    pdVar17 = lhs + lVar5 + lVar4;
    pdVar10 = lhs + lVar21 * lhsStride + lVar4;
    local_c8 = lVar21;
    do {
      dVar25 = 0.0;
      dVar26 = 0.0;
      if ((long)uVar11 < 1) {
        dVar23 = 0.0;
        dVar24 = 0.0;
      }
      else {
        uVar13 = 0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        do {
          dVar2 = rhs[uVar13];
          dVar25 = dVar25 + pdVar19[uVar13] * dVar2;
          dVar26 = dVar26 + pdVar18[uVar13] * dVar2;
          dVar23 = dVar23 + local_a0[uVar13] * dVar2;
          dVar24 = dVar24 + pdVar15[uVar13] * dVar2;
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
      }
      if ((long)uVar11 < lVar4) {
        (*(code *)(&DAT_00117338 + *(int *)(&DAT_00117338 + local_a8 * 4)))(local_a0);
        return;
      }
      if (lVar4 < cols) {
        lVar5 = 0;
        do {
          dVar2 = rhs[lVar4 + lVar5];
          dVar25 = dVar25 + pdVar10[lVar5] * dVar2;
          dVar26 = dVar26 + pdVar17[lVar5] * dVar2;
          dVar23 = dVar23 + pdVar20[lVar5] * dVar2;
          dVar24 = dVar24 + pdVar6[lVar5] * dVar2;
          lVar5 = lVar5 + 1;
        } while (cols - lVar4 != lVar5);
      }
      res[local_c8 * resIncr] = alpha * dVar25 + res[local_c8 * resIncr];
      lVar5 = (local_c8 + lVar14) * resIncr;
      res[lVar5] = dVar26 * alpha + res[lVar5];
      lVar5 = (local_c8 + 2) * resIncr;
      res[lVar5] = alpha * dVar23 + res[lVar5];
      lVar5 = (lVar1 + local_c8) * resIncr;
      res[lVar5] = dVar24 * alpha + res[lVar5];
      local_c8 = local_c8 + 4;
      pdVar15 = pdVar15 + lhsStride * 4;
      local_a0 = local_a0 + lhsStride * 4;
      pdVar18 = pdVar18 + lhsStride * 4;
      pdVar19 = pdVar19 + lhsStride * 4;
      pdVar6 = pdVar6 + lhsStride * 4;
      pdVar20 = pdVar20 + lhsStride * 4;
      pdVar17 = pdVar17 + lhsStride * 4;
      pdVar10 = pdVar10 + lhsStride * 4;
    } while (local_c8 < lVar8);
  }
  do {
    lVar14 = lVar21;
    if (lVar8 < rows) {
      pdVar15 = (double *)(lhsStride * 8 * lVar8 + (long)lhs);
      do {
        dVar25 = 0.0;
        if (0 < (long)uVar11) {
          uVar13 = 0;
          do {
            dVar25 = dVar25 + pdVar15[uVar13] * rhs[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
        if ((long)uVar11 < lVar4) {
          dVar26 = 0.0;
          dVar23 = 0.0;
          uVar13 = uVar11;
          if (((uint)lhs + (int)lVar8 * (uint)lhsStride * 8 + (int)uVar11 * 8 & 0xf) == 0) {
            do {
              dVar26 = dVar26 + pdVar15[uVar13] * rhs[uVar13];
              dVar23 = dVar23 + (pdVar15 + uVar13)[1] * (rhs + uVar13)[1];
              uVar13 = uVar13 + 2;
            } while ((long)uVar13 < lVar4);
          }
          else {
            do {
              dVar26 = dVar26 + pdVar15[uVar13] * rhs[uVar13];
              dVar23 = dVar23 + (pdVar15 + uVar13)[1] * (rhs + uVar13)[1];
              uVar13 = uVar13 + 2;
            } while ((long)uVar13 < lVar4);
          }
          dVar25 = dVar25 + dVar23 + dVar26;
        }
        lVar21 = lVar4;
        if (lVar4 < cols) {
          do {
            dVar25 = dVar25 + pdVar15[lVar21] * rhs[lVar21];
            lVar21 = lVar21 + 1;
          } while (cols != lVar21);
        }
        res[lVar8 * resIncr] = dVar25 * alpha + res[lVar8 * resIncr];
        lVar8 = lVar8 + 1;
        pdVar15 = pdVar15 + lhsStride;
      } while (lVar8 != rows);
    }
    lVar8 = 0;
    lVar21 = 0;
    rows = lVar14;
  } while (lVar14 != 0);
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,RowMajor,ConjugateLhs,RhsScalar,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsScalar* lhs, Index lhsStride,
  const RhsScalar* rhs, Index rhsIncr,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(rhsIncr);
  eigen_internal_assert(rhsIncr==1);
  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif

  #define _EIGEN_ACCUMULATE_PACKETS(A0,A13,A2) {\
    RhsPacket b = pload<RhsPacket>(&rhs[j]); \
    ptmp0 = pcj.pmadd(EIGEN_CAT(ploa,A0) <LhsPacket>(&lhs0[j]), b, ptmp0); \
    ptmp1 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs1[j]), b, ptmp1); \
    ptmp2 = pcj.pmadd(EIGEN_CAT(ploa,A2) <LhsPacket>(&lhs2[j]), b, ptmp2); \
    ptmp3 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs3[j]), b, ptmp3); }

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  enum { AllAligned=0, EvenAligned=1, FirstAligned=2, NoneAligned=3 };
  const Index rowsAtOnce = 4;
  const Index peels = 2;
  const Index RhsPacketAlignedMask = RhsPacketSize-1;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
//   const Index PeelAlignedMask = RhsPacketSize*peels-1;
  const Index depth = cols;

  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type
  // if that's not the case then vectorization is discarded, see below.
  Index alignedStart = internal::first_aligned(rhs, depth);
  Index alignedSize = RhsPacketSize>1 ? alignedStart + ((depth-alignedStart) & ~RhsPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                         : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                         : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = internal::first_aligned(lhs,depth);

  // find how many rows do we have to skip to be aligned with rhs (if possible)
  Index skipRows = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (sizeof(LhsScalar)!=sizeof(RhsScalar)) || (size_t(lhs)%sizeof(LhsScalar)) || (size_t(rhs)%sizeof(RhsScalar)) )
  {
    alignedSize = 0;
    alignedStart = 0;
  }
  else if (LhsPacketSize>1)
  {
    eigen_internal_assert(size_t(lhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0  || depth<LhsPacketSize);

    while (skipRows<LhsPacketSize &&
           alignedStart != ((lhsAlignmentOffset + alignmentStep*skipRows)%LhsPacketSize))
      ++skipRows;
    if (skipRows==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipRows = 0;
    }
    else
    {
      skipRows = (std::min)(skipRows,Index(rows));
      // note that the skiped columns are processed later.
    }
    eigen_internal_assert(  alignmentPattern==NoneAligned
                      || LhsPacketSize==1
                      || (skipRows + rowsAtOnce >= rows)
                      || LhsPacketSize > depth
                      || (size_t(lhs+alignedStart+lhsStride*skipRows)%sizeof(LhsPacket))==0);
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = depth;
    alignmentPattern = AllAligned;
  }

  Index offset1 = (FirstAligned && alignmentStep==1?3:1);
  Index offset3 = (FirstAligned && alignmentStep==1?1:3);

  Index rowBound = ((rows-skipRows)/rowsAtOnce)*rowsAtOnce + skipRows;
  for (Index i=skipRows; i<rowBound; i+=rowsAtOnce)
  {
    EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
    ResScalar tmp1 = ResScalar(0), tmp2 = ResScalar(0), tmp3 = ResScalar(0);

    // this helps the compiler generating good binary code
    const LhsScalar *lhs0 = lhs + i*lhsStride,     *lhs1 = lhs + (i+offset1)*lhsStride,
                    *lhs2 = lhs + (i+2)*lhsStride, *lhs3 = lhs + (i+offset3)*lhsStride;

    if (Vectorizable)
    {
      /* explicit vectorization */
      ResPacket ptmp0 = pset1<ResPacket>(ResScalar(0)), ptmp1 = pset1<ResPacket>(ResScalar(0)),
                ptmp2 = pset1<ResPacket>(ResScalar(0)), ptmp3 = pset1<ResPacket>(ResScalar(0));

      // process initial unaligned coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
      {
        RhsScalar b = rhs[j];
        tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
        tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,d,d);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,d);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if (peels>1)
            {
              /* Here we proccess 4 rows with with two peeled iterations to hide
               * the overhead of unaligned loads. Moreover unaligned loads are handled
               * using special shift/move operations between the two aligned packets
               * overlaping the desired unaligned packet. This is *much* more efficient
               * than basic unaligned loads.
               */
              LhsPacket A01, A02, A03, A11, A12, A13;
              A01 = pload<LhsPacket>(&lhs1[alignedStart-1]);
              A02 = pload<LhsPacket>(&lhs2[alignedStart-2]);
              A03 = pload<LhsPacket>(&lhs3[alignedStart-3]);

              for (; j<peeledSize; j+=peels*RhsPacketSize)
              {
                RhsPacket b = pload<RhsPacket>(&rhs[j]);
                A11 = pload<LhsPacket>(&lhs1[j-1+LhsPacketSize]);  palign<1>(A01,A11);
                A12 = pload<LhsPacket>(&lhs2[j-2+LhsPacketSize]);  palign<2>(A02,A12);
                A13 = pload<LhsPacket>(&lhs3[j-3+LhsPacketSize]);  palign<3>(A03,A13);

                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), b, ptmp0);
                ptmp1 = pcj.pmadd(A01, b, ptmp1);
                A01 = pload<LhsPacket>(&lhs1[j-1+2*LhsPacketSize]);  palign<1>(A11,A01);
                ptmp2 = pcj.pmadd(A02, b, ptmp2);
                A02 = pload<LhsPacket>(&lhs2[j-2+2*LhsPacketSize]);  palign<2>(A12,A02);
                ptmp3 = pcj.pmadd(A03, b, ptmp3);
                A03 = pload<LhsPacket>(&lhs3[j-3+2*LhsPacketSize]);  palign<3>(A13,A03);

                b = pload<RhsPacket>(&rhs[j+RhsPacketSize]);
                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j+LhsPacketSize]), b, ptmp0);
                ptmp1 = pcj.pmadd(A11, b, ptmp1);
                ptmp2 = pcj.pmadd(A12, b, ptmp2);
                ptmp3 = pcj.pmadd(A13, b, ptmp3);
              }
            }
            for (; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,du);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(du,du,du);
            break;
        }
        tmp0 += predux(ptmp0);
        tmp1 += predux(ptmp1);
        tmp2 += predux(ptmp2);
        tmp3 += predux(ptmp3);
      }
    } // end explicit vectorization

    // process remaining coeffs (or all if no explicit vectorization)
    // FIXME this loop get vectorized by the compiler !
    for (Index j=alignedSize; j<depth; ++j)
    {
      RhsScalar b = rhs[j];
      tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
      tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
    }
    res[i*resIncr]            += alpha*tmp0;
    res[(i+offset1)*resIncr]  += alpha*tmp1;
    res[(i+2)*resIncr]        += alpha*tmp2;
    res[(i+offset3)*resIncr]  += alpha*tmp3;
  }

  // process remaining first and last rows (at most columnsAtOnce-1)
  Index end = rows;
  Index start = rowBound;
  do
  {
    for (Index i=start; i<end; ++i)
    {
      EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
      ResPacket ptmp0 = pset1<ResPacket>(tmp0);
      const LhsScalar* lhs0 = lhs + i*lhsStride;
      // process first unaligned result's coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);

      if (alignedSize>alignedStart)
      {
        // process aligned rhs coeffs
        if ((size_t(lhs0+alignedStart)%sizeof(LhsPacket))==0)
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        else
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(ploadu<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        tmp0 += predux(ptmp0);
      }

      // process remaining scalars
      // FIXME this loop get vectorized by the compiler !
      for (Index j=alignedSize; j<depth; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);
      res[i*resIncr] += alpha*tmp0;
    }
    if (skipRows)
    {
      start = 0;
      end = skipRows;
      skipRows = 0;
    }
    else
      break;
  } while(Vectorizable);

  #undef _EIGEN_ACCUMULATE_PACKETS
}